

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

int fy_document_resolve(fy_document *fyd)

{
  undefined1 *puVar1;
  _Bool _Var2;
  int iVar3;
  fy_node *fyn_parent;
  
  if (fyd == (fy_document *)0x0) {
    iVar3 = 0;
  }
  else {
    fy_node_clear_system_marks(fyd->root);
    _Var2 = fy_check_ref_loop(fyd,fyd->root,FYNWF_FOLLOW,(fy_node_walk_ctx *)0x0);
    fy_node_clear_system_marks(fyd->root);
    if (_Var2) {
      iVar3 = -1;
    }
    else {
      iVar3 = fy_resolve_anchor_node(fyd,fyd->root);
      if (iVar3 == 0) {
        fy_resolve_parent_node((fy_document *)fyd->root,(fy_node *)0x0,fyn_parent);
        return 0;
      }
    }
    puVar1 = &fyd->diag->field_0x3c;
    *puVar1 = *puVar1 & 0xfe;
  }
  return iVar3;
}

Assistant:

int fy_document_resolve(struct fy_document *fyd) {
    int rc;
    bool ret;

    if (!fyd)
        return 0;

    fy_node_clear_system_marks(fyd->root);

    /* for resolution to work, no reference loops should exist */
    ret = fy_check_ref_loop(fyd, fyd->root,
                            FYNWF_MAXDEPTH_DEFAULT | FYNWF_FOLLOW, NULL);

    fy_node_clear_system_marks(fyd->root);

    if (ret)
        goto err_out;


    /* now resolve any anchor nodes */
    rc = fy_resolve_anchor_node(fyd, fyd->root);
    if (rc)
        goto err_out_rc;

    /* redo parent resolution */
    fy_resolve_parent_node(fyd, fyd->root, NULL);

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    fyd->diag->on_error = false;
    return rc;
}